

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::reserve
          (vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *this,size_t n)

{
  Image *pIVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  if (this->nAlloc < n) {
    pIVar1 = pmr::polymorphic_allocator<pbrt::Image>::allocate_object<pbrt::Image>(&this->alloc,n);
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < this->nStored; uVar3 = uVar3 + 1) {
      pbrt::Image::Image((Image *)((long)&pIVar1->format + lVar2),
                         (Image *)((long)&this->ptr->format + lVar2));
      pbrt::Image::~Image((Image *)((long)&this->ptr->format + lVar2));
      lVar2 = lVar2 + 0x98;
    }
    pmr::polymorphic_allocator<pbrt::Image>::deallocate_object<pbrt::Image>
              (&this->alloc,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pIVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }